

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugLine.cpp
# Opt level: O0

void __thiscall
llvm::DWARFDebugLine::ContentTypeTracker::trackContentType
          (ContentTypeTracker *this,LineNumberEntryFormat ContentType)

{
  LineNumberEntryFormat ContentType_local;
  ContentTypeTracker *this_local;
  
  if (ContentType == DW_LNCT_timestamp) {
    this->HasModTime = true;
  }
  else if (ContentType == DW_LNCT_size) {
    this->HasLength = true;
  }
  else if (ContentType == DW_LNCT_MD5) {
    this->HasMD5 = true;
  }
  else if (ContentType == DW_LNCT_LLVM_source) {
    this->HasSource = true;
  }
  return;
}

Assistant:

void DWARFDebugLine::ContentTypeTracker::trackContentType(
    dwarf::LineNumberEntryFormat ContentType) {
  switch (ContentType) {
  case dwarf::DW_LNCT_timestamp:
    HasModTime = true;
    break;
  case dwarf::DW_LNCT_size:
    HasLength = true;
    break;
  case dwarf::DW_LNCT_MD5:
    HasMD5 = true;
    break;
  case dwarf::DW_LNCT_LLVM_source:
    HasSource = true;
    break;
  default:
    // We only care about values we consider optional, and new values may be
    // added in the vendor extension range, so we do not match exhaustively.
    break;
  }
}